

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.pb.cc
# Opt level: O3

char * __thiscall
CoreML::Specification::Int64Parameter::_InternalParse
          (Int64Parameter *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  byte bVar1;
  bool bVar2;
  Int64Range *msg;
  uint uVar3;
  ulong uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  byte *p;
  Arena *pAVar5;
  char cVar6;
  uint uVar7;
  pair<const_char_*,_unsigned_int> pVar8;
  pair<const_char_*,_unsigned_long> pVar9;
  byte *local_30;
  
  local_30 = (byte *)ptr;
  bVar2 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_30,ctx->group_depth_);
  if (!bVar2) {
    this_00 = &(this->super_MessageLite)._internal_metadata_;
    do {
      bVar1 = *local_30;
      uVar7 = (uint)bVar1;
      p = local_30 + 1;
      if ((char)bVar1 < '\0') {
        uVar7 = ((uint)bVar1 + (uint)*p * 0x80) - 0x80;
        if ((char)*p < '\0') {
          pVar8 = google::protobuf::internal::ReadTagFallback((char *)local_30,uVar7);
          p = (byte *)pVar8.first;
          uVar7 = pVar8.second;
        }
        else {
          p = local_30 + 2;
        }
      }
      uVar3 = uVar7 >> 3;
      cVar6 = (char)uVar7;
      local_30 = p;
      if (uVar3 == 0xb) {
        if (cVar6 != 'Z') goto LAB_002ba38a;
        if (this->_oneof_case_[0] != 0xb) {
          clear_AllowedValues(this);
          this->_oneof_case_[0] = 0xb;
          uVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
          pAVar5 = (Arena *)(uVar4 & 0xfffffffffffffffc);
          if ((uVar4 & 1) != 0) {
            pAVar5 = *(Arena **)pAVar5;
          }
          msg = (Int64Range *)
                google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Int64Set>(pAVar5)
          ;
          goto LAB_002ba3eb;
        }
LAB_002ba384:
        msg = (this->AllowedValues_).range_;
LAB_002ba3f7:
        local_30 = (byte *)google::protobuf::internal::ParseContext::ParseMessage
                                     (ctx,&msg->super_MessageLite,(char *)local_30);
LAB_002ba407:
        if (local_30 == (byte *)0x0) {
          return (char *)0x0;
        }
      }
      else {
        if (uVar3 == 10) {
          if (cVar6 == 'R') {
            if (this->_oneof_case_[0] == 10) goto LAB_002ba384;
            clear_AllowedValues(this);
            this->_oneof_case_[0] = 10;
            uVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
            pAVar5 = (Arena *)(uVar4 & 0xfffffffffffffffc);
            if ((uVar4 & 1) != 0) {
              pAVar5 = *(Arena **)pAVar5;
            }
            msg = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Int64Range>
                            (pAVar5);
LAB_002ba3eb:
            (this->AllowedValues_).range_ = msg;
            goto LAB_002ba3f7;
          }
LAB_002ba38a:
          if ((uVar7 == 0) || ((uVar7 & 7) == 4)) {
            if (p == (byte *)0x0) {
              return (char *)0x0;
            }
            (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar7 - 1;
            return (char *)p;
          }
          uVar4 = this_00->ptr_;
          if ((uVar4 & 1) == 0) {
            unknown = google::protobuf::internal::InternalMetadata::
                      mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
          }
          else {
            unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((uVar4 & 0xfffffffffffffffc) + 8);
          }
          local_30 = (byte *)google::protobuf::internal::UnknownFieldParse
                                       (uVar7,unknown,(char *)local_30,ctx);
          goto LAB_002ba407;
        }
        if ((uVar3 != 1) || (cVar6 != '\b')) goto LAB_002ba38a;
        uVar4 = (ulong)(char)*p;
        local_30 = p + 1;
        if ((long)uVar4 < 0) {
          uVar7 = ((uint)*local_30 * 0x80 + (uint)*p) - 0x80;
          if ((char)*local_30 < '\0') {
            local_30 = p;
            pVar9 = google::protobuf::internal::VarintParseSlow64((char *)p,uVar7);
            local_30 = (byte *)pVar9.first;
            this->defaultvalue_ = pVar9.second;
            goto LAB_002ba407;
          }
          uVar4 = (ulong)uVar7;
          local_30 = p + 2;
        }
        this->defaultvalue_ = uVar4;
      }
      bVar2 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_30,ctx->group_depth_);
    } while (!bVar2);
  }
  return (char *)local_30;
}

Assistant:

const char* Int64Parameter::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // int64 defaultValue = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 8)) {
          defaultvalue_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.Int64Range range = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 82)) {
          ptr = ctx->ParseMessage(_internal_mutable_range(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.Int64Set set = 11;
      case 11:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 90)) {
          ptr = ctx->ParseMessage(_internal_mutable_set(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}